

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O1

int glfwGetGamepadState(int jid,GLFWgamepadstate *state)

{
  uint8_t uVar1;
  char cVar2;
  char cVar3;
  byte bVar4;
  _GLFWmapping *p_Var5;
  GLFWbool GVar6;
  int iVar7;
  long lVar8;
  uchar uVar9;
  int iVar10;
  float fVar11;
  
  if (jid < 0) {
    __assert_fail("jid >= GLFW_JOYSTICK_1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/glfw/src/input.c"
                  ,0x500,"int glfwGetGamepadState(int, GLFWgamepadstate *)");
  }
  if (0xf < jid) {
    __assert_fail("jid <= GLFW_JOYSTICK_LAST",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/glfw/src/input.c"
                  ,0x501,"int glfwGetGamepadState(int, GLFWgamepadstate *)");
  }
  if (state == (GLFWgamepadstate *)0x0) {
    __assert_fail("state != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/glfw/src/input.c"
                  ,0x502,"int glfwGetGamepadState(int, GLFWgamepadstate *)");
  }
  state->axes[0] = 0.0;
  state->axes[1] = 0.0;
  state->axes[2] = 0.0;
  state->axes[3] = 0.0;
  state->buttons[0] = '\0';
  state->buttons[1] = '\0';
  state->buttons[2] = '\0';
  state->buttons[3] = '\0';
  state->buttons[4] = '\0';
  state->buttons[5] = '\0';
  state->buttons[6] = '\0';
  state->buttons[7] = '\0';
  *(undefined8 *)(state->buttons + 8) = 0;
  state->axes[4] = 0.0;
  state->axes[5] = 0.0;
  if (_glfw.initialized == 0) {
    iVar10 = 0;
    _glfwInputError(0x10001,(char *)0x0);
  }
  else {
    GVar6 = initJoysticks();
    iVar7 = 0;
    iVar10 = 0;
    if ((((GVar6 != 0) && (iVar10 = iVar7, _glfw.joysticks[(uint)jid].present != 0)) &&
        (iVar7 = _glfwPlatformPollJoystick(_glfw.joysticks + (uint)jid,3), iVar7 != 0)) &&
       (_glfw.joysticks[(uint)jid].mapping != (_GLFWmapping *)0x0)) {
      lVar8 = 0;
      do {
        p_Var5 = _glfw.joysticks[(uint)jid].mapping;
        uVar1 = p_Var5->buttons[lVar8].type;
        if (uVar1 == '\x03') {
          bVar4 = p_Var5->buttons[lVar8].index;
          uVar9 = '\x01';
          if ((_glfw.joysticks[(uint)jid].hats[bVar4 >> 4] & bVar4 & 0xf) == 0) goto LAB_006e4079;
LAB_006e4076:
          state->buttons[lVar8] = uVar9;
        }
        else {
          if (uVar1 == '\x02') {
            uVar9 = _glfw.joysticks[(uint)jid].buttons[p_Var5->buttons[lVar8].index];
            goto LAB_006e4076;
          }
          if (uVar1 == '\x01') {
            cVar2 = p_Var5->buttons[lVar8].axisScale;
            cVar3 = p_Var5->buttons[lVar8].axisOffset;
            fVar11 = (float)(int)cVar2 *
                     _glfw.joysticks[(uint)jid].axes[p_Var5->buttons[lVar8].index] +
                     (float)(int)cVar3;
            if ((cVar3 < '\0') || ((cVar3 == '\0' && ('\0' < cVar2)))) {
              uVar9 = '\x01';
              if (0.0 <= fVar11) goto LAB_006e4076;
            }
            else {
              uVar9 = '\x01';
              if (fVar11 <= 0.0) goto LAB_006e4076;
            }
          }
        }
LAB_006e4079:
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0xf);
      lVar8 = 0;
      do {
        p_Var5 = _glfw.joysticks[(uint)jid].mapping;
        uVar1 = p_Var5->axes[lVar8].type;
        if (uVar1 == '\x03') {
          bVar4 = p_Var5->axes[lVar8].index;
          fVar11 = *(float *)(&DAT_006fd790 +
                             (ulong)((_glfw.joysticks[(uint)jid].hats[bVar4 >> 4] & bVar4 & 0xf) ==
                                    0) * 4);
LAB_006e417a:
          state->axes[lVar8] = fVar11;
        }
        else {
          if (uVar1 == '\x02') {
            fVar11 = (float)_glfw.joysticks[(uint)jid].buttons[p_Var5->axes[lVar8].index];
            fVar11 = fVar11 + fVar11 + -1.0;
            goto LAB_006e417a;
          }
          if (uVar1 == '\x01') {
            fVar11 = _glfw_fmaxf((float)(int)p_Var5->axes[lVar8].axisScale *
                                 _glfw.joysticks[(uint)jid].axes[p_Var5->axes[lVar8].index] +
                                 (float)(int)p_Var5->axes[lVar8].axisOffset,-1.0);
            fVar11 = _glfw_fminf(fVar11,1.0);
            goto LAB_006e417a;
          }
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != 6);
      iVar10 = 1;
    }
  }
  return iVar10;
}

Assistant:

GLFWAPI int glfwGetGamepadState(int jid, GLFWgamepadstate* state)
{
    int i;
    _GLFWjoystick* js;

    assert(jid >= GLFW_JOYSTICK_1);
    assert(jid <= GLFW_JOYSTICK_LAST);
    assert(state != NULL);

    memset(state, 0, sizeof(GLFWgamepadstate));

    _GLFW_REQUIRE_INIT_OR_RETURN(GLFW_FALSE);

    if (jid < 0 || jid > GLFW_JOYSTICK_LAST)
    {
        _glfwInputError(GLFW_INVALID_ENUM, "Invalid joystick ID %i", jid);
        return GLFW_FALSE;
    }

    if (!initJoysticks())
        return GLFW_FALSE;

    js = _glfw.joysticks + jid;
    if (!js->present)
        return GLFW_FALSE;

    if (!_glfwPlatformPollJoystick(js, _GLFW_POLL_ALL))
        return GLFW_FALSE;

    if (!js->mapping)
        return GLFW_FALSE;

    for (i = 0;  i <= GLFW_GAMEPAD_BUTTON_LAST;  i++)
    {
        const _GLFWmapelement* e = js->mapping->buttons + i;
        if (e->type == _GLFW_JOYSTICK_AXIS)
        {
            const float value = js->axes[e->index] * e->axisScale + e->axisOffset;
            // HACK: This should be baked into the value transform
            // TODO: Bake into transform when implementing output modifiers
            if (e->axisOffset < 0 || (e->axisOffset == 0 && e->axisScale > 0))
            {
                if (value >= 0.f)
                    state->buttons[i] = GLFW_PRESS;
            }
            else
            {
                if (value <= 0.f)
                    state->buttons[i] = GLFW_PRESS;
            }
        }
        else if (e->type == _GLFW_JOYSTICK_HATBIT)
        {
            const unsigned int hat = e->index >> 4;
            const unsigned int bit = e->index & 0xf;
            if (js->hats[hat] & bit)
                state->buttons[i] = GLFW_PRESS;
        }
        else if (e->type == _GLFW_JOYSTICK_BUTTON)
            state->buttons[i] = js->buttons[e->index];
    }

    for (i = 0;  i <= GLFW_GAMEPAD_AXIS_LAST;  i++)
    {
        const _GLFWmapelement* e = js->mapping->axes + i;
        if (e->type == _GLFW_JOYSTICK_AXIS)
        {
            const float value = js->axes[e->index] * e->axisScale + e->axisOffset;
            state->axes[i] = _glfw_fminf(_glfw_fmaxf(value, -1.f), 1.f);
        }
        else if (e->type == _GLFW_JOYSTICK_HATBIT)
        {
            const unsigned int hat = e->index >> 4;
            const unsigned int bit = e->index & 0xf;
            if (js->hats[hat] & bit)
                state->axes[i] = 1.f;
            else
                state->axes[i] = -1.f;
        }
        else if (e->type == _GLFW_JOYSTICK_BUTTON)
            state->axes[i] = js->buttons[e->index] * 2.f - 1.f;
    }

    return GLFW_TRUE;
}